

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeSet::_generatePattern(UnicodeSet *this,UnicodeString *result,UBool escapeUnprintable)

{
  int iVar1;
  UnicodeString *pUVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  UChar local_48 [4];
  ulong local_40;
  UChar local_36 [3];
  
  local_36[0] = L'[';
  UnicodeString::doAppend(result,local_36,0,1);
  iVar6 = this->len;
  uVar4 = iVar6 / 2;
  if (iVar6 < 4) {
    if (iVar6 < 2) goto LAB_002c393d;
  }
  else if ((*this->list == 0) && (this->list[(ulong)(uVar4 * 2) - 1] == 0x110000)) {
    local_36[1] = 0x5e;
    UnicodeString::doAppend(result,local_36 + 1,0,1);
    local_40 = 2;
    if (2 < (int)uVar4) {
      local_40 = (ulong)uVar4;
    }
    uVar3 = 1;
    do {
      iVar6 = this->list[uVar3 * 2 + -1];
      iVar1 = this->list[uVar3 * 2];
      iVar5 = iVar1 + -1;
      _appendToPat(result,iVar6,escapeUnprintable);
      if (iVar6 != iVar5) {
        if (iVar6 != iVar1 + -2) {
          local_48[0] = L'-';
          UnicodeString::doAppend(result,local_48,0,1);
        }
        _appendToPat(result,iVar5,escapeUnprintable);
      }
      uVar3 = uVar3 + 1;
    } while (local_40 != uVar3);
    goto LAB_002c393d;
  }
  local_40 = (ulong)uVar4;
  uVar3 = 0;
  do {
    iVar6 = this->list[uVar3 * 2];
    iVar1 = this->list[uVar3 * 2 + 1];
    iVar5 = iVar1 + -1;
    _appendToPat(result,iVar6,escapeUnprintable);
    if (iVar6 != iVar5) {
      if (iVar6 != iVar1 + -2) {
        local_48[1] = 0x2d;
        UnicodeString::doAppend(result,local_48 + 1,0,1);
      }
      _appendToPat(result,iVar5,escapeUnprintable);
    }
    uVar3 = uVar3 + 1;
  } while (local_40 != uVar3);
LAB_002c393d:
  if (0 < this->strings->count) {
    iVar6 = 0;
    do {
      local_48[2] = 0x7b;
      UnicodeString::doAppend(result,local_48 + 2,0,1);
      pUVar2 = (UnicodeString *)UVector::elementAt(this->strings,iVar6);
      _appendToPat(result,pUVar2,escapeUnprintable);
      local_48[3] = 0x7d;
      UnicodeString::doAppend(result,local_48 + 3,0,1);
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->strings->count);
  }
  local_36[2] = 0x5d;
  pUVar2 = UnicodeString::doAppend(result,local_36 + 2,0,1);
  return pUVar2;
}

Assistant:

UnicodeString& UnicodeSet::_generatePattern(UnicodeString& result,
                                            UBool escapeUnprintable) const
{
    result.append(SET_OPEN);

//  // Check against the predefined categories.  We implicitly build
//  // up ALL category sets the first time toPattern() is called.
//  for (int8_t cat=0; cat<Unicode::GENERAL_TYPES_COUNT; ++cat) {
//      if (*this == getCategorySet(cat)) {
//          result.append(COLON);
//          result.append(CATEGORY_NAMES, cat*2, 2);
//          return result.append(CATEGORY_CLOSE);
//      }
//  }

    int32_t count = getRangeCount();

    // If the set contains at least 2 intervals and includes both
    // MIN_VALUE and MAX_VALUE, then the inverse representation will
    // be more economical.
    if (count > 1 &&
        getRangeStart(0) == MIN_VALUE &&
        getRangeEnd(count-1) == MAX_VALUE) {

        // Emit the inverse
        result.append(COMPLEMENT);

        for (int32_t i = 1; i < count; ++i) {
            UChar32 start = getRangeEnd(i-1)+1;
            UChar32 end = getRangeStart(i)-1;
            _appendToPat(result, start, escapeUnprintable);
            if (start != end) {
                if ((start+1) != end) {
                    result.append(HYPHEN);
                }
                _appendToPat(result, end, escapeUnprintable);
            }
        }
    }

    // Default; emit the ranges as pairs
    else {
        for (int32_t i = 0; i < count; ++i) {
            UChar32 start = getRangeStart(i);
            UChar32 end = getRangeEnd(i);
            _appendToPat(result, start, escapeUnprintable);
            if (start != end) {
                if ((start+1) != end) {
                    result.append(HYPHEN);
                }
                _appendToPat(result, end, escapeUnprintable);
            }
        }
    }

    for (int32_t i = 0; i<strings->size(); ++i) {
        result.append(OPEN_BRACE);
        _appendToPat(result,
                     *(const UnicodeString*) strings->elementAt(i),
                     escapeUnprintable);
        result.append(CLOSE_BRACE);
    }
    return result.append(SET_CLOSE);
}